

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void HUF_fillDTableX2ForWeight
               (HUF_DEltX2 *DTableRank,sortedSymbol_t *begin,sortedSymbol_t *end,U32 nbBits,
               U32 tableLog,U16 baseSeq,int level)

{
  uint uVar1;
  HUF_DEltX2 HVar2;
  U64 UVar3;
  HUF_DEltX2 *pHVar4;
  char in_CL;
  ulong uVar5;
  long in_RDX;
  long in_RSI;
  HUF_DEltX2 *in_RDI;
  char in_R8B;
  int in_stack_00000008;
  HUF_DEltX2 *DTableRankEnd;
  U64 DEltX2_2;
  U64 DEltX2_1;
  U64 DEltX2;
  HUF_DEltX2 DElt_1;
  HUF_DEltX2 DElt;
  sortedSymbol_t *ptr;
  U32 length;
  U32 in_stack_ffffffffffffff98;
  U32 in_stack_ffffffffffffff9c;
  long local_30;
  HUF_DEltX2 *local_8;
  
  uVar1 = 1 << (in_R8B - in_CL & 0x1fU);
  if ((0 < in_stack_00000008) && (in_stack_00000008 < 3)) {
    uVar5 = (ulong)(uVar1 - 1);
    local_30 = in_RSI;
    local_8 = in_RDI;
    switch(uVar5) {
    case 0:
      local_8 = in_RDI;
      for (; local_30 != in_RDX; local_30 = local_30 + 1) {
        HVar2 = HUF_buildDEltX2((U32)uVar5,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        *local_8 = HVar2;
        local_8 = local_8 + 1;
      }
      break;
    case 1:
      for (; local_30 != in_RDX; local_30 = local_30 + 1) {
        HVar2 = HUF_buildDEltX2((U32)uVar5,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
        *local_8 = HVar2;
        local_8[1] = HVar2;
        local_8 = local_8 + 2;
      }
      break;
    default:
      for (; local_30 != in_RDX; local_30 = local_30 + 1) {
        UVar3 = HUF_buildDEltX2U64((U32)(uVar5 >> 0x20),(U32)uVar5,
                                   (U16)(in_stack_ffffffffffffff9c >> 0x10),
                                   in_stack_ffffffffffffff98);
        pHVar4 = local_8 + uVar1;
        for (; local_8 != pHVar4; local_8 = local_8 + 8) {
          *(U64 *)local_8 = UVar3;
          *(U64 *)(local_8 + 2) = UVar3;
          *(U64 *)(local_8 + 4) = UVar3;
          *(U64 *)(local_8 + 6) = UVar3;
        }
      }
      break;
    case 3:
      for (; local_30 != in_RDX; local_30 = local_30 + 1) {
        UVar3 = HUF_buildDEltX2U64((U32)(uVar5 >> 0x20),(U32)uVar5,
                                   (U16)(in_stack_ffffffffffffff9c >> 0x10),
                                   in_stack_ffffffffffffff98);
        *(U64 *)local_8 = UVar3;
        *(U64 *)(local_8 + 2) = UVar3;
        local_8 = local_8 + 4;
      }
      break;
    case 7:
      for (; local_30 != in_RDX; local_30 = local_30 + 1) {
        UVar3 = HUF_buildDEltX2U64((U32)(uVar5 >> 0x20),(U32)uVar5,
                                   (U16)(in_stack_ffffffffffffff9c >> 0x10),
                                   in_stack_ffffffffffffff98);
        *(U64 *)local_8 = UVar3;
        *(U64 *)(local_8 + 2) = UVar3;
        *(U64 *)(local_8 + 4) = UVar3;
        *(U64 *)(local_8 + 6) = UVar3;
        local_8 = local_8 + 8;
      }
    }
    return;
  }
  __assert_fail("level >= 1 && level <= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8ffd,
                "void HUF_fillDTableX2ForWeight(HUF_DEltX2 *, const sortedSymbol_t *, const sortedSymbol_t *, U32, U32, U16, const int)"
               );
}

Assistant:

static void HUF_fillDTableX2ForWeight(
    HUF_DEltX2* DTableRank,
    sortedSymbol_t const* begin, sortedSymbol_t const* end,
    U32 nbBits, U32 tableLog,
    U16 baseSeq, int const level)
{
    U32 const length = 1U << ((tableLog - nbBits) & 0x1F /* quiet static-analyzer */);
    const sortedSymbol_t* ptr;
    assert(level >= 1 && level <= 2);
    switch (length) {
    case 1:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            *DTableRank++ = DElt;
        }
        break;
    case 2:
        for (ptr = begin; ptr != end; ++ptr) {
            HUF_DEltX2 const DElt = HUF_buildDEltX2(ptr->symbol, nbBits, baseSeq, level);
            DTableRank[0] = DElt;
            DTableRank[1] = DElt;
            DTableRank += 2;
        }
        break;
    case 4:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            DTableRank += 4;
        }
        break;
    case 8:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
            ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            DTableRank += 8;
        }
        break;
    default:
        for (ptr = begin; ptr != end; ++ptr) {
            U64 const DEltX2 = HUF_buildDEltX2U64(ptr->symbol, nbBits, baseSeq, level);
            HUF_DEltX2* const DTableRankEnd = DTableRank + length;
            for (; DTableRank != DTableRankEnd; DTableRank += 8) {
                ZSTD_memcpy(DTableRank + 0, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 2, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 4, &DEltX2, sizeof(DEltX2));
                ZSTD_memcpy(DTableRank + 6, &DEltX2, sizeof(DEltX2));
            }
        }
        break;
    }
}